

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_adj.c
# Opt level: O0

REF_STATUS ref_adj_degree(REF_ADJ ref_adj,REF_INT node,REF_INT *degree)

{
  REF_INT local_28;
  REF_INT local_24;
  REF_INT item;
  REF_INT *degree_local;
  REF_INT node_local;
  REF_ADJ ref_adj_local;
  
  *degree = 0;
  if ((node < 0) || (ref_adj->nnode <= node)) {
    local_28 = -1;
  }
  else {
    local_28 = ref_adj->first[node];
  }
  for (local_24 = local_28; local_24 != -1; local_24 = ref_adj->item[local_24].next) {
    *degree = *degree + 1;
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_adj_degree(REF_ADJ ref_adj, REF_INT node,
                                  REF_INT *degree) {
  REF_INT item;
  *degree = 0;

  for (item = ref_adj_first(ref_adj, node); ref_adj_valid(item);
       (item) = ref_adj_item_next(ref_adj, item))
    (*degree)++;

  return REF_SUCCESS;
}